

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode resolve_unix(Curl_easy *data,connectdata *conn,char *unix_path)

{
  Curl_addrinfo *pCVar1;
  _Bool local_31;
  long *plStack_30;
  _Bool longpath;
  Curl_dns_entry *hostaddr;
  char *unix_path_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  plStack_30 = (long *)0x0;
  local_31 = false;
  hostaddr = (Curl_dns_entry *)unix_path;
  unix_path_local = (char *)conn;
  conn_local = (connectdata *)data;
  plStack_30 = (long *)(*Curl_ccalloc)(1,0x20);
  if (plStack_30 == (long *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pCVar1 = Curl_unix2addr((char *)hostaddr,&local_31,
                            (*(ulong *)(unix_path_local + 0x3e0) >> 0x1a & 1) != 0);
    *plStack_30 = (long)pCVar1;
    if (*plStack_30 == 0) {
      if ((local_31 & 1U) != 0) {
        Curl_failf((Curl_easy *)conn_local,"Unix socket path too long: \'%s\'",hostaddr);
      }
      (*Curl_cfree)(plStack_30);
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      if ((local_31 & 1U) != 0) {
        data_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
      }
    }
    else {
      plStack_30[2] = 1;
      *(long **)(unix_path_local + 0x90) = plStack_30;
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode resolve_unix(struct Curl_easy *data,
                             struct connectdata *conn,
                             char *unix_path)
{
  struct Curl_dns_entry *hostaddr = NULL;
  bool longpath = FALSE;

  DEBUGASSERT(unix_path);
  DEBUGASSERT(conn->dns_entry == NULL);

  /* Unix domain sockets are local. The host gets ignored, just use the
   * specified domain socket address. Do not cache "DNS entries". There is
   * no DNS involved and we already have the filesystem path available. */
  hostaddr = calloc(1, sizeof(struct Curl_dns_entry));
  if(!hostaddr)
    return CURLE_OUT_OF_MEMORY;

  hostaddr->addr = Curl_unix2addr(unix_path, &longpath,
                                  conn->bits.abstract_unix_socket);
  if(!hostaddr->addr) {
    if(longpath)
      /* Long paths are not supported for now */
      failf(data, "Unix socket path too long: '%s'", unix_path);
    free(hostaddr);
    return longpath ? CURLE_COULDNT_RESOLVE_HOST : CURLE_OUT_OF_MEMORY;
  }

  hostaddr->refcount = 1; /* connection is the only one holding this */
  conn->dns_entry = hostaddr;
  return CURLE_OK;
}